

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::~IfcBeamType(IfcBeamType *this)

{
  ~IfcBeamType((IfcBeamType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}